

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_ThreadSafety::Run(void)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  ThreadReturn *thread_return;
  void *vthread_return;
  int i_1;
  int num_times_string_to_template_cache_returned_true;
  ThreadReturn *first_thread_return;
  int i;
  pthread_t thread_ids [10];
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string filename;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"(testing thread-safety)",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  for (first_thread_return._4_4_ = 0; first_thread_return._4_4_ < 10;
      first_thread_return._4_4_ = first_thread_return._4_4_ + 1) {
    lVar4 = (long)first_thread_return._4_4_;
    pvVar3 = (void *)std::__cxx11::string::c_str();
    iVar2 = pthread_create((pthread_t *)(&stack0xffffffffffffff48 + lVar4 * 8),(pthread_attr_t *)0x0
                           ,RunThread,pvVar3);
    if (iVar2 != 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x585,
             "pthread_create(thread_ids+i, NULL, RunThread, (void*)filename.c_str()) == 0");
      lVar4 = (long)first_thread_return._4_4_;
      pvVar3 = (void *)std::__cxx11::string::c_str();
      iVar2 = pthread_create((pthread_t *)(&stack0xffffffffffffff48 + lVar4 * 8),
                             (pthread_attr_t *)0x0,RunThread,pvVar3);
      if (iVar2 != 0) {
        __assert_fail("pthread_create(thread_ids+i, __null, RunThread, (void*)filename.c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x585,"static void Test_Template_ThreadSafety::Run()");
      }
      exit(1);
    }
  }
  _i_1 = (ThreadReturn *)0x0;
  vthread_return._4_4_ = 0;
  vthread_return._0_4_ = 0;
  do {
    if (9 < (int)vthread_return) {
      if (_i_1 != (ThreadReturn *)0x0) {
        operator_delete(_i_1);
      }
      bVar1 = anon_unknown.dwarf_a67e::IntEqVerbose(1,vthread_return._4_4_);
      if (bVar1) {
        ctemplate::Template::ClearCache();
        std::__cxx11::string::~string((string *)local_28);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x59e,
             "IntEqVerbose(1, num_times_string_to_template_cache_returned_true)");
      bVar1 = anon_unknown.dwarf_a67e::IntEqVerbose(1,vthread_return._4_4_);
      if (bVar1) {
        exit(1);
      }
      __assert_fail("IntEqVerbose(1, num_times_string_to_template_cache_returned_true)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x59e,"static void Test_Template_ThreadSafety::Run()");
    }
    iVar2 = pthread_join(*(pthread_t *)(&stack0xffffffffffffff48 + (long)(int)vthread_return * 8),
                         &thread_return);
    if (iVar2 != 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x58d,
             "pthread_join(thread_ids[i], &vthread_return) == 0");
      iVar2 = pthread_join(*(pthread_t *)(&stack0xffffffffffffff48 + (long)(int)vthread_return * 8),
                           &thread_return);
      if (iVar2 != 0) {
        __assert_fail("pthread_join(thread_ids[i], &vthread_return) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x58d,"static void Test_Template_ThreadSafety::Run()");
      }
      exit(1);
    }
    if ((thread_return->string_to_template_cache_return & 1U) != 0) {
      vthread_return._4_4_ = vthread_return._4_4_ + 1;
    }
    if (_i_1 == (ThreadReturn *)0x0) {
      _i_1 = thread_return;
    }
    else {
      if (thread_return->file_template != _i_1->file_template) {
        printf("ASSERT FAILED, line %d: %s\n",0x597,
               "thread_return->file_template == first_thread_return->file_template");
        if (thread_return->file_template != _i_1->file_template) {
          __assert_fail("thread_return->file_template == first_thread_return->file_template",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x597,"static void Test_Template_ThreadSafety::Run()");
        }
        exit(1);
      }
      if (thread_return->string_template != _i_1->string_template) {
        printf("ASSERT FAILED, line %d: %s\n",0x599,
               "thread_return->string_template == first_thread_return->string_template");
        if (thread_return->string_template != _i_1->string_template) {
          __assert_fail("thread_return->string_template == first_thread_return->string_template",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x599,"static void Test_Template_ThreadSafety::Run()");
        }
        exit(1);
      }
      if (thread_return != (ThreadReturn *)0x0) {
        operator_delete(thread_return);
      }
    }
    vthread_return._0_4_ = (int)vthread_return + 1;
  } while( true );
}

Assistant:

TEST(Template, ThreadSafety) {
  string filename = StringToTemplateFile("(testing thread-safety)");

  // GetTemplate() is the most thread-contended routine.  We get a
  // template in many threads, and assert we get the same template
  // from each.
  pthread_t thread_ids[kNumThreads];
  for (int i = 0; i < kNumThreads; ++i) {
    ASSERT(pthread_create(thread_ids+i, NULL, RunThread,
                          (void*)filename.c_str())
           == 0);
  }

  // Wait for all the threads to terminate (should be very quick!)
  ThreadReturn* first_thread_return = NULL;
  int num_times_string_to_template_cache_returned_true = 0;
  for (int i = 0; i < kNumThreads; ++i) {
    void* vthread_return;
    ASSERT(pthread_join(thread_ids[i], &vthread_return) == 0);
    ThreadReturn* thread_return =
        reinterpret_cast<ThreadReturn*>(vthread_return);
    if (thread_return->string_to_template_cache_return) {
      ++num_times_string_to_template_cache_returned_true;
    }
    if (first_thread_return == NULL) {   // we're the first thread
      first_thread_return = thread_return;
    } else {
      ASSERT(thread_return->file_template ==
             first_thread_return->file_template);
      ASSERT(thread_return->string_template ==
             first_thread_return->string_template);
      delete thread_return;
    }
  }
  delete first_thread_return;
  ASSERT_INTEQ(1, num_times_string_to_template_cache_returned_true);
  Template::ClearCache();
}